

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# si_function.hpp
# Opt level: O1

double __thiscall
sisl::si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3>::operator()
          (si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3> *this,vector *p)

{
  double local_38;
  void *local_30 [2];
  transform *local_20;
  vector *local_18;
  
  if (this->_lattice == (cartesian_cubic<float> *)0x0) {
    local_38 = 0.0;
  }
  else {
    local_18 = p;
    if (this->_bForceScale == false) {
      if ((this->_mSpaceTransform).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols !=
          (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)
      goto LAB_0010dbc8;
      local_20 = &this->_mSpaceTransform;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_30,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                  *)&local_20);
      local_38 = __fast_cubic_tp_linear__<float>((vector *)local_30,this->_lattice);
    }
    else {
      if ((this->_mSpaceTransform).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols !=
          (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
LAB_0010dbc8:
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                      "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                     );
      }
      local_20 = &this->_mSpaceTransform;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_30,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                  *)&local_20);
      local_38 = basis_function::convolution_sum_h<3,sisl::cartesian_cubic<float>,sisl::tp_linear>
                           ((vector *)local_30,this->_lattice,&this->_dBasisScale);
    }
    free(local_30[0]);
  }
  return local_38;
}

Assistant:

virtual const double operator()(const vector &p) const {
            if(_lattice == nullptr) return 0;

            if(!_bForceScale) {
                return BF::template convolution_sum<N, L, BF>(
                            _mSpaceTransform*p,
                            (const L*)_lattice);
            }
            return BF::template convolution_sum_h<N, L, BF>(
                        _mSpaceTransform*p,
                        (const L*)_lattice,
                        _dBasisScale);
        }